

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O1

string * __thiscall
fasttext::Args::boolToString_abi_cxx11_(string *__return_storage_ptr__,Args *this,bool b)

{
  undefined7 in_register_00000011;
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((int)CONCAT71(in_register_00000011,b) == 0) {
    pcVar2 = "false";
    pcVar1 = "";
  }
  else {
    pcVar2 = "true";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Args::boolToString(bool b) const {
  if (b) {
    return "true";
  } else {
    return "false";
  }
}